

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  GLFWbool GVar1;
  int in_EDX;
  int in_ESI;
  GLFWimage *in_RDI;
  _GLFWcursor *cursor;
  size_t in_stack_fffffffffffffff8;
  _GLFWcursor *p_Var2;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    p_Var2 = (_GLFWcursor *)0x0;
  }
  else if ((in_RDI->width < 1) || (in_RDI->height < 1)) {
    _glfwInputError(0x10004,"Invalid image dimensions for cursor");
    p_Var2 = (_GLFWcursor *)0x0;
  }
  else {
    p_Var2 = (_GLFWcursor *)_glfw_calloc(in_stack_fffffffffffffff8,(size_t)in_RDI);
    p_Var2->next = _glfw.cursorListHead;
    _glfw.cursorListHead = p_Var2;
    GVar1 = (*_glfw.platform.createCursor)(p_Var2,in_RDI,in_ESI,in_EDX);
    if (GVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)in_RDI);
      p_Var2 = (_GLFWcursor *)0x0;
    }
  }
  return (GLFWcursor *)p_Var2;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    _GLFWcursor* cursor;

    assert(image != NULL);
    assert(image->pixels != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (image->width <= 0 || image->height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid image dimensions for cursor");
        return NULL;
    }

    cursor = _glfw_calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfw.platform.createCursor(cursor, image, xhot, yhot))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}